

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.h
# Opt level: O2

Subscriber __thiscall
miniros::NodeHandle::subscribe<rosgraph_msgs::Log_<std::allocator<void>>,miniros::master::Rosout>
          (NodeHandle *this,string *topic,uint32_t queue_size,offset_in_Rosout_to_subr fp,
          Rosout *obj,TransportHints *transport_hints)

{
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Subscriber SVar1;
  TransportHints *in_stack_00000010;
  SubscribeOptions ops;
  function<void_(const_std::shared_ptr<const_rosgraph_msgs::Log_<std::allocator<void>_>_>_&)>
  fStack_158;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  undefined1 local_118 [24];
  SubscribeOptions local_100;
  
  local_100.topic._M_dataplus._M_p = (pointer)&local_100.topic.field_2;
  local_100.topic._M_string_length = 0;
  local_100.topic.field_2._M_local_buf[0] = '\0';
  local_100.queue_size = 1;
  local_100.md5sum._M_dataplus._M_p = (pointer)&local_100.md5sum.field_2;
  local_100.md5sum._M_string_length = 0;
  local_100.md5sum.field_2._M_local_buf[0] = '\0';
  local_100.datatype._M_dataplus._M_p = (pointer)&local_100.datatype.field_2;
  local_100.datatype._M_string_length = 0;
  local_100.datatype.field_2._M_local_buf[0] = '\0';
  local_100.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_100.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_100.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_100.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_100.helper.
  super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_100.helper.
  super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_1_ = 0;
  local_100.helper.
  super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._1_7_ = 0;
  local_100.callback_queue._0_1_ = 0;
  local_100._121_8_ = 0;
  local_100.tracked_object.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_100.tracked_object.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_100.transport_hints.transports_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transport_hints.transports_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_100.transport_hints.transports_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_118._0_8_ = obj;
  local_118._8_8_ = transport_hints;
  local_100.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_100.transport_hints.options_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::function<void(std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>>const>const&)>::
  function<miniros::NodeHandle::subscribe<rosgraph_msgs::Log_<std::allocator<void>>,miniros::master::Rosout>(std::__cxx11::string_const&,unsigned_int,void(miniros::master::Rosout::*)(std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>>const>const&),miniros::master::Rosout*,miniros::TransportHints_const&)::_lambda(std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>>const>const&)_1_&,void>
            ((function<void(std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>>const>const&)>
              *)&fStack_158,(anon_class_24_2_75ef8c4f *)local_118);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = master::std::
              _Function_handler<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_(),_miniros::DefaultMessageCreator<rosgraph_msgs::Log_<std::allocator<void>_>_>_>
              ::_M_invoke;
  local_128 = master::std::
              _Function_handler<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_(),_miniros::DefaultMessageCreator<rosgraph_msgs::Log_<std::allocator<void>_>_>_>
              ::_M_manager;
  SubscribeOptions::init<rosgraph_msgs::Log_<std::allocator<void>>>
            (&local_100,(string *)CONCAT44(in_register_00000014,queue_size),(uint32_t)fp,&fStack_158
             ,(function<std::shared_ptr<rosgraph_msgs::Log_<std::allocator<void>_>_>_()> *)
              &local_138);
  std::_Function_base::~_Function_base((_Function_base *)&local_138);
  std::_Function_base::~_Function_base((_Function_base *)&fStack_158);
  TransportHints::operator=(&local_100.transport_hints,in_stack_00000010);
  subscribe(this,(SubscribeOptions *)topic);
  SubscribeOptions::~SubscribeOptions(&local_100);
  SVar1.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar1.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Subscriber)
         SVar1.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Subscriber subscribe(const std::string& topic, uint32_t queue_size, 
                       void(T::*fp)(const std::shared_ptr<M const>&), T* obj, 
                       const TransportHints& transport_hints = TransportHints())
  {
    SubscribeOptions ops;
    auto wrapFn = [fp, obj](const std::shared_ptr<M const>& msg){(obj->*fp)(msg);};
    ops.template init<M>(topic, queue_size, wrapFn);
    ops.transport_hints = transport_hints;
    return subscribe(ops);
  }